

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O2

void BinaryenAtomicWaitSetExpected(BinaryenExpressionRef expr,BinaryenExpressionRef expectedExpr)

{
  if (expr->_id != AtomicWaitId) {
    __assert_fail("expression->is<AtomicWait>()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                  ,0xc1f,
                  "void BinaryenAtomicWaitSetExpected(BinaryenExpressionRef, BinaryenExpressionRef)"
                 );
  }
  if (expectedExpr != (BinaryenExpressionRef)0x0) {
    *(BinaryenExpressionRef *)(expr + 2) = expectedExpr;
    return;
  }
  __assert_fail("expectedExpr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                ,0xc20,
                "void BinaryenAtomicWaitSetExpected(BinaryenExpressionRef, BinaryenExpressionRef)");
}

Assistant:

void BinaryenAtomicWaitSetExpected(BinaryenExpressionRef expr,
                                   BinaryenExpressionRef expectedExpr) {
  auto* expression = (Expression*)expr;
  assert(expression->is<AtomicWait>());
  assert(expectedExpr);
  static_cast<AtomicWait*>(expression)->expected = (Expression*)expectedExpr;
}